

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O0

void __thiscall
duckdb::SelectionVector::SelectionVector(SelectionVector *this,idx_t start,idx_t count)

{
  SelectionVector *in_RDX;
  idx_t in_RDI;
  idx_t loc;
  idx_t i;
  SelectionVector *in_stack_ffffffffffffffd0;
  SelectionVector *this_00;
  
  loc = in_RDI + 8;
  shared_ptr<duckdb::SelectionData,_true>::shared_ptr
            ((shared_ptr<duckdb::SelectionData,_true> *)0xc7077b);
  MaxValue<unsigned_long>((unsigned_long)in_RDX,0x800);
  Initialize(in_stack_ffffffffffffffd0,in_RDI);
  for (this_00 = (SelectionVector *)0x0; this_00 < in_RDX;
      this_00 = (SelectionVector *)((long)&this_00->sel_vector + 1)) {
    set_index(this_00,in_RDI,loc);
  }
  return;
}

Assistant:

SelectionVector(idx_t start, idx_t count) {
		Initialize(MaxValue<idx_t>(count, STANDARD_VECTOR_SIZE));
		for (idx_t i = 0; i < count; i++) {
			set_index(i, start + i);
		}
	}